

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O3

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,unsigned_char>
          (TryCast *this,string_t input,uint8_t *result,bool strict)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  idx_t iVar15;
  ulong uVar16;
  byte bVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  ulong uVar22;
  IntegerCastData<short> local_7a;
  IntegerDecimalCastData<unsigned_char> local_78;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = input.value._0_8_;
  lVar12 = input.value._0_8_;
  if ((uint)this < 0xd) {
    lVar12 = (long)&local_40 + 4;
  }
  if ((uint)this == 0) {
    return false;
  }
  uVar16 = (ulong)this & 0xffffffff;
  uVar4 = 0;
  do {
    bVar7 = *(byte *)(lVar12 + uVar4);
    bVar6 = (byte)result;
    if ((4 < bVar7 - 9) && (bVar7 != 0x20)) {
      if (bVar7 == 0x2d) {
        uVar13 = uVar16 - uVar4;
        uVar18 = 1;
        goto LAB_0027e655;
      }
      if ((uVar16 - 1 == uVar4) || (bVar7 != 0x30)) {
        if ((bVar7 == 0x2b & bVar6) != 0) break;
        uVar13 = (ulong)(bVar7 == 0x2b);
      }
      else {
        bVar7 = *(byte *)(lVar12 + 1 + uVar4);
        if (bVar7 < 0x62) {
          if (bVar7 == 0x42) {
LAB_0027e93e:
            uVar13 = ~uVar4 + uVar16;
            if (1 < uVar13) {
              uVar18 = 1;
              bVar7 = 0;
              goto LAB_0027e959;
            }
            break;
          }
          if (bVar7 == 0x58) {
LAB_0027e829:
            uVar13 = ~uVar4 + uVar16;
            if (1 < uVar13) {
              uVar18 = 1;
              bVar7 = 0;
              goto LAB_0027e84f;
            }
            break;
          }
        }
        else {
          if (bVar7 == 0x62) goto LAB_0027e93e;
          if (bVar7 == 0x78) goto LAB_0027e829;
        }
        if (((byte)(bVar7 - 0x30) < 10 & bVar6) != 0) break;
        uVar13 = 0;
      }
      uVar18 = uVar16 - uVar4;
      if (uVar18 <= uVar13) {
        bVar7 = 0;
        uVar22 = 1;
        goto LAB_0027eae9;
      }
      bVar7 = 0;
      uVar9 = uVar13;
      goto LAB_0027e776;
    }
    uVar4 = uVar4 + 1;
  } while (uVar16 != uVar4);
  goto LAB_0027eb26;
  while (lVar19 = lVar12 + uVar18, uVar18 = uVar18 + 1, *(char *)(uVar4 + lVar19) == '0') {
LAB_0027e655:
    if (uVar13 <= uVar18) {
      if (uVar16 - 1 != uVar4) {
        bVar7 = 0;
        uVar18 = 1;
        goto LAB_0027e6ce;
      }
      break;
    }
  }
  goto LAB_0027eb26;
  while( true ) {
    bVar7 = (bVar7 * '\n' - bVar17) + 0x30;
    uVar22 = uVar13;
    if (~uVar18 + uVar16 == uVar4) break;
    if (*(char *)(uVar4 + 1 + lVar19) == '_' && bVar6 == 0) {
      if (((uVar16 - uVar18) - 2 == uVar4) ||
         (uVar22 = uVar18 + 2, 9 < (byte)(*(char *)(uVar4 + lVar12 + uVar22) - 0x30U)))
      goto LAB_0027eb26;
    }
    else {
      uVar22 = uVar18 + 1;
    }
    uVar18 = uVar22;
    if (uVar13 <= uVar22) break;
LAB_0027e6ce:
    lVar19 = uVar18 + lVar12;
    bVar17 = *(byte *)(uVar4 + lVar19);
    if (9 < (byte)(bVar17 - 0x30)) {
      uVar9 = uVar18;
      if (bVar17 == 0x2e) {
        if (bVar6 != 0) goto LAB_0027eb26;
        uVar9 = uVar18 + 1;
        if (uVar13 <= uVar9) {
          if (uVar18 < 2) goto LAB_0027eb26;
          goto LAB_0027eaee;
        }
        if ((uVar18 < 2) || (bVar17 = *(byte *)(uVar4 + 1 + lVar19), (byte)(bVar17 - 0x30) < 10))
        goto LAB_0027eb26;
      }
      if ((4 < bVar17 - 9) && (bVar17 != 0x20)) goto LAB_0027eb26;
      uVar9 = uVar9 + 1;
      uVar22 = uVar9;
      if (uVar9 < uVar13) goto LAB_0027ea41;
      break;
    }
  }
  goto LAB_0027ea6c;
  while (uVar9 = uVar9 + 1, uVar22 = uVar13, uVar13 != uVar9) {
LAB_0027ea41:
    bVar17 = *(byte *)(uVar4 + lVar12 + uVar9);
    if ((4 < bVar17 - 9) && (bVar17 != 0x20)) goto LAB_0027eb26;
  }
LAB_0027ea6c:
  if (1 < uVar22) goto LAB_0027eaee;
  goto LAB_0027eb26;
  while( true ) {
    uVar9 = uVar13;
    if ((uVar16 - uVar18) - 2 != uVar4) {
      if (*(char *)(uVar4 + 2 + lVar19) == '_') {
        if (((uVar16 - uVar18) - 3 == uVar4) || ((*(byte *)(uVar4 + 3 + lVar19) & 0xfe) != 0x30))
        goto LAB_0027eb26;
        uVar9 = uVar18 + 2;
      }
      else {
        uVar9 = uVar18 + 1;
      }
    }
    uVar18 = uVar9;
    if ((char)bVar7 < '\0') goto LAB_0027eb26;
    bVar7 = bVar7 * '\x02' | bVar17;
    if (uVar13 <= uVar18) break;
LAB_0027e959:
    lVar19 = uVar18 + lVar12;
    cVar1 = *(char *)(uVar4 + 1 + lVar19);
    if (cVar1 == '0') {
      bVar17 = 0;
    }
    else {
      if (cVar1 != '1') goto LAB_0027eb26;
      bVar17 = 1;
    }
  }
  goto LAB_0027eaee;
  while( true ) {
    uVar18 = uVar9;
    if ((byte)~bVar8 >> 4 < bVar7) goto LAB_0027eb26;
    bVar7 = bVar8 + bVar7 * '\x10';
    if (uVar13 <= uVar18) break;
LAB_0027e84f:
    lVar19 = uVar18 + lVar12;
    bVar17 = *(byte *)(uVar4 + 1 + lVar19);
    bVar2 = bVar17 | 0x20;
    if (0x19 < (byte)(bVar17 + 0xbf)) {
      bVar2 = bVar17;
    }
    bVar17 = bVar2 - 0x30;
    if ((byte)(bVar2 + 0x9f) < 6 || bVar17 < 10) {
      bVar8 = bVar2 + 0xa9;
      if (bVar2 < 0x61) {
        bVar8 = bVar17;
      }
    }
    else {
      bVar8 = bVar17;
      if (5 < (byte)(bVar2 + 0xbf)) goto LAB_0027eb26;
    }
    uVar9 = uVar13;
    if ((uVar16 - uVar18) - 2 != uVar4) {
      if (*(char *)(uVar4 + 2 + lVar19) == '_') {
        if ((uVar16 - uVar18) - 3 == uVar4) goto LAB_0027eb26;
        bVar17 = *(byte *)(uVar4 + 3 + lVar19);
        uVar9 = uVar18 + 2;
        if ((9 < (byte)(bVar17 - 0x30)) &&
           ((uVar20 = bVar17 - 0x41, 0x25 < uVar20 ||
            ((0x3f0000003fU >> ((ulong)uVar20 & 0x3f) & 1) == 0)))) goto LAB_0027eb26;
      }
      else {
        uVar9 = uVar18 + 1;
      }
    }
  }
  goto LAB_0027eaee;
  while( true ) {
    if ((byte)(0x2f - bVar17) / 10 < bVar7) goto LAB_0027eb26;
    bVar7 = (bVar17 - 0x30) + bVar7 * '\n';
    uVar22 = uVar18;
    if (~uVar9 + uVar16 == uVar4) break;
    if (*(char *)(uVar4 + 1 + lVar19) == '_' && bVar6 == 0) {
      if (((uVar16 - uVar9) - 2 == uVar4) ||
         (uVar9 = uVar9 + 2, 9 < (byte)(*(char *)(uVar4 + lVar12 + uVar9) - 0x30U)))
      goto LAB_0027eb26;
    }
    else {
      uVar9 = uVar9 + 1;
    }
    uVar22 = uVar9;
    if (uVar18 <= uVar9) break;
LAB_0027e776:
    lVar19 = uVar9 + lVar12;
    bVar17 = *(byte *)(uVar4 + lVar19);
    if (9 < (byte)(bVar17 - 0x30)) {
      uVar22 = uVar9;
      if (bVar17 == 0x2e) {
        if (bVar6 != 0) goto LAB_0027eb26;
        uVar22 = uVar9 + 1;
        if (uVar18 <= uVar22) {
          if (uVar9 <= uVar13) goto LAB_0027eb26;
          break;
        }
        if ((uVar9 <= uVar13) ||
           (bVar17 = *(byte *)(uVar4 + 1 + lVar19), (byte)(bVar17 - 0x30) < 10)) goto LAB_0027eb26;
      }
      if ((4 < bVar17 - 9) && (bVar17 != 0x20)) goto LAB_0027eb26;
      uVar9 = uVar22 + 1;
      uVar22 = uVar9;
      if (uVar9 < uVar18) goto LAB_0027eac2;
      break;
    }
  }
  goto LAB_0027eae9;
LAB_0027f0b2:
  local_48 = uVar11;
  local_58 = uVar22 + lVar12;
  bVar7 = *(byte *)(uVar4 + local_58);
  bVar17 = bVar7 - 0x30;
  if (9 < bVar17) {
    local_78._16_8_ = local_48 & 0xffff;
    if (uVar22 <= local_50 && uVar9 <= uVar18) {
      return false;
    }
LAB_0027f2cf:
    uVar20 = (uint)bVar7;
    if (bVar7 < 0x20) {
      if (4 < uVar20 - 9) {
        return false;
      }
LAB_0027f2e5:
      uVar22 = uVar22 + 1;
      uVar21 = uVar22;
      if (uVar22 < uVar13) {
        do {
          bVar7 = *(byte *)(uVar4 + lVar12 + uVar22);
          if ((4 < bVar7 - 9) && (bVar7 != 0x20)) {
            return false;
          }
          uVar22 = uVar22 + 1;
          uVar21 = uVar13;
        } while (uVar13 != uVar22);
      }
      goto LAB_0027f178;
    }
    if ((bVar7 != 0x65) && (uVar20 != 0x45)) {
      if (uVar20 != 0x20) {
        return false;
      }
      goto LAB_0027f2e5;
    }
    if (uVar22 == uVar18 || bVar6 != 0) {
      return false;
    }
    if (uVar13 <= uVar22 + 1) {
      return false;
    }
    local_7a.result = 0;
    pcVar14 = (char *)(uVar4 + lVar12 + uVar22 + 1);
    iVar15 = ~uVar4 + (uVar16 - uVar22);
    if (*pcVar14 == '-') {
      bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar14,iVar15,&local_7a,false);
    }
    else {
      bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                        (pcVar14,iVar15,&local_7a,false);
    }
    if (bVar3 == false) {
      return false;
    }
    bVar3 = IntegerDecimalCastOperation::
            HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                      (&local_78,local_7a.result);
    goto LAB_0027ef42;
  }
  uVar11 = local_48;
  uVar20 = (uint)local_60;
  if (local_78.decimal <= (long)(((ulong)bVar17 ^ 0x7ffffffffffffffe) / 10)) {
    local_78.decimal = local_78.decimal * 10 + (ulong)bVar17;
    uVar11 = (ulong)((uint)local_60 + 1);
    uVar20 = (uint)local_60 + 1;
  }
  uVar21 = uVar13;
  if (~uVar22 + uVar16 != uVar4) goto code_r0x0027f116;
  goto LAB_0027f380;
code_r0x0027f116:
  if (*(char *)(uVar4 + 1 + local_58) == '_') {
    if ((uVar16 - uVar22) - 2 == uVar4) {
      return false;
    }
    uVar22 = uVar22 + 2;
    if (9 < (byte)(*(char *)(uVar4 + lVar12 + uVar22) - 0x30U)) {
      return false;
    }
  }
  else {
    uVar22 = uVar22 + 1;
  }
  local_60 = CONCAT44(local_60._4_4_,uVar20);
  uVar21 = uVar22;
  if (uVar13 <= uVar22) goto LAB_0027f380;
  goto LAB_0027f0b2;
LAB_0027f380:
  local_78._16_8_ = uVar11 & 0xffff;
LAB_0027f38b:
  if ((uVar9 <= uVar18) && (uVar21 <= local_50)) {
    return false;
  }
  goto LAB_0027f178;
LAB_0027ef9a:
  uVar10 = uVar11;
  bVar7 = *(byte *)(uVar4 + uVar9 + lVar12);
  bVar17 = bVar7 - 0x30;
  local_58 = uVar22;
  if (9 < bVar17) {
    local_78._16_8_ = uVar10 & 0xffff;
    if (uVar9 <= uVar22 && uVar18 < 2) {
      return false;
    }
LAB_0027f1c7:
    uVar20 = (uint)bVar7;
    if (0x1f < bVar7) {
      if ((bVar7 != 0x65) && (uVar20 != 0x45)) {
        if (uVar20 != 0x20) {
          return false;
        }
        goto LAB_0027f1dd;
      }
      if (uVar9 == 1 || bVar6 != 0) {
        return false;
      }
      if (uVar13 <= uVar9 + 1) {
        return false;
      }
      local_7a.result = 0;
      pcVar14 = (char *)(uVar4 + lVar12 + uVar9 + 1);
      iVar15 = ~uVar4 + (uVar16 - uVar9);
      if (*pcVar14 == '-') {
        bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar14,iVar15,&local_7a,false);
      }
      else {
        bVar3 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                          (pcVar14,iVar15,&local_7a,false);
      }
      if (bVar3 == false) {
        return false;
      }
      bVar3 = IntegerDecimalCastOperation::
              HandleExponent<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                        (&local_78,local_7a.result);
      goto LAB_0027ef42;
    }
    if (4 < uVar20 - 9) {
      return false;
    }
LAB_0027f1dd:
    uVar9 = uVar9 + 1;
    uVar21 = uVar9;
    if (uVar9 < uVar13) {
      do {
        bVar7 = *(byte *)(uVar4 + lVar12 + uVar9);
        if ((4 < bVar7 - 9) && (bVar7 != 0x20)) {
          return false;
        }
        uVar9 = uVar9 + 1;
        uVar21 = uVar13;
      } while (uVar13 != uVar9);
    }
    goto LAB_0027f04e;
  }
  uVar11 = uVar10;
  if (local_78.decimal <= (long)(((ulong)bVar17 ^ 0x7ffffffffffffffe) / 10)) {
    uVar20 = uVar20 + 1;
    local_78.decimal = local_78.decimal * 10 + (ulong)bVar17;
    uVar11 = (ulong)uVar20;
  }
  uVar21 = uVar13;
  local_60 = uVar10;
  if (~uVar9 + uVar16 != uVar4) goto code_r0x0027eff9;
  goto LAB_0027f280;
code_r0x0027eff9:
  if (*(char *)(uVar4 + 1 + uVar9 + lVar12) == '_') {
    if ((uVar16 - uVar9) - 2 == uVar4) {
      return false;
    }
    uVar9 = uVar9 + 2;
    if (9 < (byte)(*(char *)(uVar4 + lVar12 + uVar9) - 0x30U)) {
      return false;
    }
  }
  else {
    uVar9 = uVar9 + 1;
  }
  uVar21 = uVar9;
  if (uVar13 <= uVar9) goto LAB_0027f280;
  goto LAB_0027ef9a;
LAB_0027f280:
  local_78._16_8_ = uVar11 & 0xffff;
LAB_0027f28f:
  if ((uVar18 < 2) && (uVar21 <= uVar22)) {
    return false;
  }
  goto LAB_0027f04e;
  while (uVar9 = uVar9 + 1, uVar22 = uVar18, uVar18 != uVar9) {
LAB_0027eac2:
    bVar17 = *(byte *)(uVar4 + lVar12 + uVar9);
    if ((4 < bVar17 - 9) && (bVar17 != 0x20)) goto LAB_0027eb26;
  }
LAB_0027eae9:
  if (uVar13 < uVar22) {
LAB_0027eaee:
    *input.value._8_8_ = bVar7;
    return true;
  }
LAB_0027eb26:
  uVar4 = 0;
  while ((bVar7 = *(byte *)(lVar12 + uVar4), bVar7 - 9 < 5 || (bVar7 == 0x20))) {
    uVar4 = uVar4 + 1;
    if (uVar16 == uVar4) {
      return false;
    }
  }
  local_78.result = 0;
  local_78.decimal = 0;
  local_78._16_8_ = 0;
  uVar13 = uVar16 - uVar4;
  local_40 = this;
  if (bVar7 == 0x2d) {
    lVar19 = 1;
    while (uVar13 + (uVar13 == 0) != lVar19) {
      lVar5 = lVar12 + lVar19;
      lVar19 = lVar19 + 1;
      if (*(char *)(uVar4 + lVar5) != '0') {
        return false;
      }
    }
    if (uVar16 - 1 == uVar4) {
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>
                (&local_78);
      return false;
    }
    uVar18 = 1;
    local_78.result = 0;
    do {
      bVar7 = *(byte *)(uVar4 + uVar18 + lVar12);
      bVar17 = bVar7 - 0x30;
      if (9 < bVar17) {
        uVar9 = uVar18;
        if (bVar7 != 0x2e) goto LAB_0027f1c7;
        if (bVar6 != 0) {
          return false;
        }
        uVar22 = uVar18 + 1;
        uVar21 = uVar22;
        if (uVar13 <= uVar22) goto LAB_0027f28f;
        local_78.decimal = 0;
        uVar20 = 0;
        uVar11 = 0;
        uVar9 = uVar22;
        goto LAB_0027ef9a;
      }
      uVar9 = (0x8000000000000000 - (ulong)bVar17) / 10;
      if (SBORROW8(local_78.result,-uVar9) != (long)(local_78.result + uVar9) < 0) {
        return false;
      }
      local_78.result = local_78.result * 10 - (ulong)bVar17;
      uVar21 = uVar13;
      if (~uVar18 + uVar16 == uVar4) break;
      if (*(char *)(uVar4 + 1 + uVar18 + lVar12) == '_' && bVar6 == 0) {
        if ((uVar16 - uVar18) - 2 == uVar4) {
          return false;
        }
        uVar18 = uVar18 + 2;
        if (9 < (byte)(*(char *)(uVar4 + lVar12 + uVar18) - 0x30U)) {
          return false;
        }
      }
      else {
        uVar18 = uVar18 + 1;
      }
      uVar21 = uVar18;
    } while (uVar18 < uVar13);
LAB_0027f04e:
    bVar3 = IntegerDecimalCastOperation::
            Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,true>(&local_78);
    if (!bVar3) {
      return false;
    }
    if (uVar21 < 2) {
      return false;
    }
    goto LAB_0027f197;
  }
  if ((uVar16 - 1 == uVar4) || (bVar7 != 0x30)) {
    if ((bVar7 == 0x2b & bVar6) != 0) {
      return false;
    }
    uVar18 = (ulong)(bVar7 == 0x2b);
LAB_0027ec01:
    if (uVar13 <= uVar18) goto LAB_0027ef4b;
    local_78.result = 0;
    uVar9 = uVar18;
    do {
      bVar7 = *(byte *)(uVar4 + uVar9 + lVar12);
      bVar17 = bVar7 - 0x30;
      if (9 < bVar17) {
        uVar22 = uVar9;
        if (bVar7 != 0x2e) goto LAB_0027f2cf;
        if (bVar6 != 0) {
          return false;
        }
        local_50 = uVar9 + 1;
        uVar21 = local_50;
        if (uVar13 <= local_50) goto LAB_0027f38b;
        local_78.decimal = 0;
        local_60 = local_60 & 0xffffffff00000000;
        uVar11 = 0;
        uVar22 = local_50;
        goto LAB_0027f0b2;
      }
      if ((long)(((ulong)bVar17 ^ 0x7ffffffffffffffe) / 10) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 10 + (ulong)bVar17;
      uVar21 = uVar13;
      if (~uVar9 + uVar16 == uVar4) break;
      if (*(char *)(uVar4 + 1 + uVar9 + lVar12) == '_' && bVar6 == 0) {
        if ((uVar16 - uVar9) - 2 == uVar4) {
          return false;
        }
        uVar9 = uVar9 + 2;
        if (9 < (byte)(*(char *)(uVar4 + lVar12 + uVar9) - 0x30U)) {
          return false;
        }
      }
      else {
        uVar9 = uVar9 + 1;
      }
      uVar21 = uVar9;
    } while (uVar9 < uVar13);
LAB_0027f178:
    bVar3 = IntegerDecimalCastOperation::
            Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>(&local_78);
    if (!bVar3) {
      return false;
    }
    if (uVar21 <= uVar18) {
      return false;
    }
    goto LAB_0027f197;
  }
  bVar7 = *(byte *)(lVar12 + 1 + uVar4);
  if (bVar7 < 0x62) {
    if (bVar7 != 0x42) {
      if (bVar7 != 0x58) {
LAB_0027ebc0:
        if (((byte)(bVar7 - 0x30) < 10 & bVar6) != 0) {
          return false;
        }
        uVar18 = 0;
        goto LAB_0027ec01;
      }
      goto LAB_0027ed84;
    }
LAB_0027eea6:
    uVar13 = ~uVar4 + uVar16;
    if (uVar13 < 2) goto LAB_0027ef4b;
    uVar18 = 1;
    local_78.result = 0;
    do {
      lVar19 = uVar18 + lVar12;
      cVar1 = *(char *)(uVar4 + 1 + lVar19);
      lVar5 = 0;
      if (cVar1 != '0') {
        if (cVar1 != '1') {
          return false;
        }
        lVar5 = 1;
      }
      uVar9 = uVar13;
      if ((uVar16 - uVar18) - 2 != uVar4) {
        if (*(char *)(uVar4 + 2 + lVar19) == '_') {
          if ((uVar16 - uVar18) - 3 == uVar4) {
            return false;
          }
          if ((*(byte *)(uVar4 + 3 + lVar19) & 0xfe) != 0x30) {
            return false;
          }
          uVar9 = uVar18 + 2;
        }
        else {
          uVar9 = uVar18 + 1;
        }
      }
      uVar18 = uVar9;
      if (0x3fffffffffffffff < local_78.result) {
        return false;
      }
      local_78.result = lVar5 + local_78.result * 2;
    } while (uVar18 < uVar13);
  }
  else {
    if (bVar7 == 0x62) goto LAB_0027eea6;
    if (bVar7 != 0x78) goto LAB_0027ebc0;
LAB_0027ed84:
    uVar13 = ~uVar4 + uVar16;
    if (uVar13 < 2) {
LAB_0027ef4b:
      IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                (&local_78);
      return false;
    }
    uVar18 = 1;
    local_78.result = 0;
    do {
      lVar19 = uVar18 + lVar12;
      bVar7 = *(byte *)(uVar4 + 1 + lVar19);
      bVar6 = bVar7 | 0x20;
      if (0x19 < (byte)(bVar7 + 0xbf)) {
        bVar6 = bVar7;
      }
      bVar7 = bVar6 - 0x30;
      if ((byte)(bVar6 + 0x9f) < 6 || bVar7 < 10) {
        bVar17 = bVar6 + 0xa9;
        if (bVar6 < 0x61) {
          bVar17 = bVar7;
        }
      }
      else {
        bVar17 = bVar7;
        if (5 < (byte)(bVar6 + 0xbf)) {
          return false;
        }
      }
      uVar9 = uVar13;
      if ((uVar16 - uVar18) - 2 != uVar4) {
        if (*(char *)(uVar4 + 2 + lVar19) == '_') {
          if ((uVar16 - uVar18) - 3 == uVar4) {
            return false;
          }
          bVar7 = *(byte *)(uVar4 + 3 + lVar19);
          uVar9 = uVar18 + 2;
          if (9 < (byte)(bVar7 - 0x30)) {
            uVar20 = bVar7 - 0x41;
            if (0x25 < uVar20) {
              return false;
            }
            if ((0x3f0000003fU >> ((ulong)uVar20 & 0x3f) & 1) == 0) {
              return false;
            }
          }
        }
        else {
          uVar9 = uVar18 + 1;
        }
      }
      uVar18 = uVar9;
      if ((long)((ulong)(bVar17 >> 4) ^ 0x7ffffffffffffff) < local_78.result) {
        return false;
      }
      local_78.result = local_78.result * 0x10 + (ulong)bVar17;
    } while (uVar18 < uVar13);
  }
  bVar3 = IntegerDecimalCastOperation::Finalize<duckdb::IntegerDecimalCastData<unsigned_char>,false>
                    (&local_78);
LAB_0027ef42:
  if (bVar3 == false) {
    return false;
  }
LAB_0027f197:
  *input.value._8_8_ = (byte)local_78.result;
  return true;
}

Assistant:

bool TryCast::Operation(bool input, uint16_t &result, bool strict) {
	return NumericTryCast::Operation<bool, uint16_t>(input, result, strict);
}